

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O2

bool Utilities::parseNumber<double>(string *s,double *x)

{
  char cVar1;
  char *pcVar2;
  int n;
  int iVar3;
  byte bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  long local_1a0;
  stringstream ss;
  byte abStack_180 [360];
  
  pcVar2 = (s->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  pcVar2 = pcVar2 + (cVar1 == '-');
  dVar6 = 0.0;
  while( true ) {
    bVar4 = *pcVar2 - 0x30;
    if (9 < bVar4) break;
    dVar6 = dVar6 * 10.0 + (double)(int)(char)bVar4;
    pcVar2 = pcVar2 + 1;
  }
  if (*pcVar2 == '.') {
    iVar3 = 0;
    dVar7 = 0.0;
    while( true ) {
      pcVar2 = pcVar2 + 1;
      if (9 < (byte)(*pcVar2 - 0x30U)) break;
      dVar7 = dVar7 * 10.0 + (double)(int)(char)(*pcVar2 - 0x30U);
      iVar3 = iVar3 + 1;
    }
    for (; 0 < iVar3; iVar3 = iVar3 + -1) {
      dVar7 = dVar7 / 10.0;
    }
    dVar6 = dVar6 + dVar7;
  }
  if (cVar1 == '-') {
    dVar6 = -dVar6;
  }
  *x = dVar6;
  if (*pcVar2 == '\0') {
    bVar5 = true;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0,(string *)s,_S_out|_S_in);
    std::istream::_M_extract<double>((double *)&local_1a0);
    bVar5 = (abStack_180[*(long *)(local_1a0 + -0x18)] & 5) == 0;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  }
  return bVar5;
}

Assistant:

static bool parseNumber(const std::string& s, T &x)
    {
        const char* p = s.c_str();
        T r = 0.0;
        bool neg = false;
        if (*p == '-') {
            neg = true;
            ++p;
        }
        while (*p >= '0' && *p <= '9') {
            r = (r*10.0) + (*p - '0');
            ++p;
        }
        if (*p == '.') {
            T f = 0.0;
            int n = 0;
            ++p;
            while (*p >= '0' && *p <= '9') {
                f = (f*10.0) + (*p - '0');
                ++p;
                ++n;
            }

            while (n > 0)
            {
                f = f / 10.0;
                n--;
            }

            r += f;
        }
        if (neg) {
            r = -r;
        }

        x = r;

        if (*p == '\0')
            return true;

        // for some numbers in scientific notation 
        std::stringstream ss(s);
        ss >> x;
        return !ss.fail();
    }